

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hook_debug.c
# Opt level: O0

char * find_hooked_symbol(void)

{
  void *__ptr;
  char *pcVar1;
  char *local_370;
  char *symbol_name;
  char *symbol_name_end;
  char *symbol_name_being;
  char *pcStack_348;
  int j;
  char *apprun_hooks_entry;
  char **strings;
  void *buffer [100];
  char *pcStack_10;
  int nptrs;
  
  buffer[99]._4_4_ = backtrace(&strings,100);
  __ptr = (void *)backtrace_symbols(&strings,buffer[99]._4_4_);
  if (__ptr == (void *)0x0) {
    perror("backtrace_symbols");
    exit(1);
  }
  pcStack_348 = (char *)0x0;
  for (symbol_name_being._4_4_ = 0; symbol_name_being._4_4_ < buffer[99]._4_4_;
      symbol_name_being._4_4_ = symbol_name_being._4_4_ + 1) {
    pcVar1 = strstr(*(char **)((long)__ptr + (long)symbol_name_being._4_4_ * 8),"libapprun_hooks.so"
                   );
    if (pcVar1 != (char *)0x0) {
      pcVar1 = strstr(*(char **)((long)__ptr + (long)symbol_name_being._4_4_ * 8),
                      "__libc_start_main");
      if (pcVar1 == (char *)0x0) {
        pcVar1 = strstr(*(char **)((long)__ptr + (long)symbol_name_being._4_4_ * 8),"main_hook");
        if (pcVar1 == (char *)0x0) {
          pcStack_348 = *(char **)((long)__ptr + (long)symbol_name_being._4_4_ * 8);
        }
      }
    }
  }
  if (pcStack_348 == (char *)0x0) {
    local_370 = (char *)0x0;
  }
  else {
    local_370 = strstr(pcStack_348,"(");
  }
  if (local_370 == (char *)0x0) {
    pcStack_10 = strdup("UNKNOWN");
  }
  else {
    pcVar1 = strstr(local_370,"+");
    pcStack_10 = strndup(local_370 + 1,(size_t)(pcVar1 + (-1 - (long)local_370)));
    free(__ptr);
  }
  return pcStack_10;
}

Assistant:

char *find_hooked_symbol() {
    int nptrs;
    void *buffer[BT_BUF_SIZE];
    char **strings;

    nptrs = backtrace(buffer, BT_BUF_SIZE);

    /* The call backtrace_symbols_fd(buffer, nptrs, STDOUT_FILENO)
       would produce similar output to the following: */

    strings = backtrace_symbols(buffer, nptrs);
    if (strings == NULL) {
        perror("backtrace_symbols");
        exit(EXIT_FAILURE);
    }
    char *apprun_hooks_entry = NULL;
    for (int j = 0; j < nptrs; j++) {
        if ((strstr(strings[j], "libapprun_hooks.so") != NULL)
            && (strstr(strings[j], "__libc_start_main") == NULL)
            && (strstr(strings[j], "main_hook") == NULL)) {
            apprun_hooks_entry = strings[j];
        }
    }

    char *symbol_name_being = apprun_hooks_entry != NULL ? strstr(apprun_hooks_entry, "(") : NULL;

    // symbol name lookup is not perfect, in case of failure just return UNKNOWN
    if (symbol_name_being == NULL)
        return strdup("UNKNOWN");

    char *symbol_name_end = strstr(symbol_name_being, "+");
    char *symbol_name = strndup(symbol_name_being + 1, symbol_name_end - symbol_name_being - 1);

    free(strings);
    return symbol_name;
}